

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

void check_leash(xchar x,xchar y)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  obj **ppoVar7;
  byte bVar8;
  uint uVar9;
  monst *mtmp;
  obj *poVar10;
  
  if (invent != (obj *)0x0) {
    poVar10 = invent;
    do {
      if ((poVar10->otyp == 0xf1) && (poVar10->corpsenm != 0)) {
        mtmp = level->monlist;
LAB_00140d0f:
        if (mtmp != (monst *)0x0) {
          if ((mtmp->mhp < 1) || (mtmp->m_id != poVar10->corpsenm)) goto LAB_00140d23;
          iVar3 = dist2((int)u.ux,(int)u.uy,(int)mtmp->mx,(int)mtmp->my);
          iVar4 = dist2((int)x,(int)y,(int)mtmp->mx,(int)mtmp->my);
          if (iVar3 <= iVar4) goto LAB_00140d3b;
          iVar3 = (int)mtmp->my;
          iVar4 = (int)u.ux - (int)mtmp->mx;
          bVar2 = (byte)iVar4;
          bVar8 = -bVar2;
          if (0 < iVar4) {
            bVar8 = bVar2;
          }
          if (bVar8 < 4) {
            uVar9 = u.uy - iVar3;
            uVar5 = -uVar9;
            if (0 < (int)uVar9) {
              uVar5 = uVar9;
            }
            if (uVar5 < 4) goto LAB_00140d3b;
          }
          if (((poVar10->field_0x4a & 1) == 0) || ((mtmp->data->mflags1 & 0x400) != 0)) {
            if (bVar8 < 6) {
              uVar9 = u.uy - iVar3;
              uVar5 = -uVar9;
              if (0 < (int)uVar9) {
                uVar5 = uVar9;
              }
              if (uVar5 < 6) {
                pline("You pull on the leash.");
                if (mtmp->data->msound != '\0') {
                  uVar5 = mt_random();
                  if (uVar5 % 3 == 1) {
                    yelp(mtmp);
                  }
                  else if (uVar5 % 3 == 0) {
                    growl(mtmp);
                  }
                  else {
                    whimper(mtmp);
                  }
                }
                goto LAB_00140d3b;
              }
            }
            pcVar6 = Monnam(mtmp);
            pcVar6 = s_suffix(pcVar6);
            pline("%s leash snaps loose!",pcVar6);
            ppoVar7 = &invent;
            while (ppoVar7 = &((obj *)ppoVar7)->nobj->nobj, (obj *)ppoVar7 != (obj *)0x0) {
              if ((((obj *)ppoVar7)->otyp == 0xf1) && (((obj *)ppoVar7)->corpsenm == mtmp->m_id)) {
                ((obj *)ppoVar7)->corpsenm = 0;
              }
            }
            mtmp->field_0x63 = mtmp->field_0x63 & 0xfe;
            goto LAB_00140d3b;
          }
          if (bVar8 < 6) {
            bVar2 = (byte)(u.uy - iVar3);
            bVar8 = -bVar2;
            if (0 < u.uy - iVar3) {
              bVar8 = bVar2;
            }
            if (bVar8 < 6) {
              uVar5 = mt_random();
              iVar3 = (~uVar5 | 0xfffffffe) + mtmp->mhp;
              mtmp->mhp = iVar3;
              if (0 < iVar3) {
                pcVar6 = Monnam(mtmp);
                pline("%s chokes on the leash!",pcVar6);
                cVar1 = mtmp->mtame;
                if (((long)cVar1 != 0) &&
                   (uVar5 = mt_random(), SUB168(ZEXT416(uVar5) % SEXT816((long)cVar1),0) != 0)) {
                  mtmp->mtame = mtmp->mtame + -1;
                }
                goto LAB_00140d3b;
              }
            }
          }
          uVar5 = u.uconduct.killer;
          mon_nam(mtmp);
          pline("Your leash chokes %s to death!");
          xkilled(mtmp,0);
          if (0 < mtmp->mhp) {
            u.uconduct.killer = uVar5;
          }
          goto LAB_00140d3b;
        }
        impossible("leash in use isn\'t attached to anything?");
        poVar10->corpsenm = 0;
      }
LAB_00140d3b:
      poVar10 = poVar10->nobj;
    } while (poVar10 != (obj *)0x0);
  }
  return;
LAB_00140d23:
  mtmp = mtmp->nmon;
  goto LAB_00140d0f;
}

Assistant:

void check_leash(xchar x, xchar y)
{
	struct obj *otmp;
	struct monst *mtmp;

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (otmp->otyp != LEASH || otmp->leashmon == 0) continue;
	    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		if (DEADMONSTER(mtmp)) continue;
		if ((int)mtmp->m_id == otmp->leashmon) break; 
	    }
	    if (!mtmp) {
		impossible("leash in use isn't attached to anything?");
		otmp->leashmon = 0;
		continue;
	    }
	    if (dist2(u.ux,u.uy,mtmp->mx,mtmp->my) >
		    dist2(x,y,mtmp->mx,mtmp->my)) {
		if (!um_dist(mtmp->mx, mtmp->my, 3)) {
		    ;	/* still close enough */
		} else if (otmp->cursed && !breathless(mtmp->data)) {
		    if (um_dist(mtmp->mx, mtmp->my, 5) ||
			    (mtmp->mhp -= rnd(2)) <= 0) {
			long save_pacifism = u.uconduct.killer;

			pline("Your leash chokes %s to death!", mon_nam(mtmp));
			/* hero might not have intended to kill pet, but
			   that's the result of his actions; gain experience,
			   lose pacifism, take alignment and luck hit, make
			   corpse less likely to remain tame after revival */
			xkilled(mtmp, 0);	/* no "you kill it" message */
			/* life-saving doesn't ordinarily reset this */
			if (mtmp->mhp > 0) u.uconduct.killer = save_pacifism;
		    } else {
			pline("%s chokes on the leash!", Monnam(mtmp));
			/* tameness eventually drops to 1 here (never 0) */
			if (mtmp->mtame && rn2(mtmp->mtame)) mtmp->mtame--;
		    }
		} else {
		    if (um_dist(mtmp->mx, mtmp->my, 5)) {
			pline("%s leash snaps loose!", s_suffix(Monnam(mtmp)));
			m_unleash(mtmp, FALSE);
		    } else {
			pline("You pull on the leash.");
			if (mtmp->data->msound != MS_SILENT)
			    switch (rn2(3)) {
			    case 0:  growl(mtmp);   break;
			    case 1:  yelp(mtmp);    break;
			    default: whimper(mtmp); break;
			    }
		    }
		}
	    }
	}
}